

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O2

void __thiscall CDirectiveAlign::Encode(CDirectiveAlign *this)

{
  int iVar1;
  int iVar2;
  size_t in_RCX;
  void *__buf;
  uchar AlignBuffer [128];
  undefined1 auStack_a8 [136];
  
  iVar1 = computePadding(this);
  iVar2 = 0x80;
  if (iVar1 < 0x80) {
    iVar2 = iVar1;
  }
  memset(auStack_a8,0,(long)iVar2);
  __buf = (void *)(long)iVar1;
  while( true ) {
    if ((int)__buf < 0x81) break;
    FileManager::write(g_fileManager,(int)auStack_a8,(void *)0x80,in_RCX);
    __buf = (void *)((long)__buf + -0x80);
  }
  FileManager::write(g_fileManager,(int)auStack_a8,__buf,in_RCX);
  return;
}

Assistant:

void CDirectiveAlign::Encode()
{
	unsigned char AlignBuffer[128];
	
	int n = computePadding();
	memset(AlignBuffer,0,n > 128 ? 128 : n);
	while (n > 128)
	{
		g_fileManager->write(AlignBuffer,128);
		n -= 128;
	}
	g_fileManager->write(AlignBuffer,n);
}